

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O0

bean_ptr<A> * hiberlite::Registry<A>::get(bean_ptr<A> *__return_storage_ptr__,bean_key *key)

{
  bool bVar1;
  pointer ppVar2;
  bean_key local_70;
  bean_key local_48;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_> local_20;
  iterator it;
  bean_key *key_local;
  
  it._M_node = (_Base_ptr)key;
  std::_Rb_tree_iterator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>::
  _Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<hiberlite::bean_key,_hiberlite::rb_pair<A>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
             ::find((map<hiberlite::bean_key,_hiberlite::rb_pair<A>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
                     *)rbpairs,key);
  local_20._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<hiberlite::bean_key,_hiberlite::rb_pair<A>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
       ::end((map<hiberlite::bean_key,_hiberlite::rb_pair<A>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
              *)rbpairs);
  bVar1 = std::operator==(&local_20,&local_30);
  if (bVar1) {
    bean_key::bean_key(&local_48,key);
    createBeanPtr(__return_storage_ptr__,&local_48,(A *)0x0);
    bean_key::~bean_key(&local_48);
  }
  else {
    bean_key::bean_key(&local_70,key);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>
             ::operator->(&local_20);
    bean_ptr<A>::bean_ptr(__return_storage_ptr__,&local_70,ppVar2->second);
    bean_key::~bean_key(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::get(const bean_key key)
{
	typename std::map<bean_key,rb_pair<C>* >::iterator it;
	it=rbpairs.find(key);
	if(it==rbpairs.end())
		return createBeanPtr(key,NULL);
	else
		return bean_ptr<C>(key, it->second);
}